

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.hpp
# Opt level: O2

void BruteForceTexture(int x,int y,int samps)

{
  double dVar1;
  undefined1 auVar2 [16];
  pointer ppVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  clock_t cVar7;
  uint uVar8;
  pair<Vector,_Vector> *elem;
  pointer ppVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  float local_144;
  float local_118;
  Vector v;
  double dStack_e0;
  Vector v_2;
  vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_> _filter_elems;
  int id;
  PosFilter filter;
  Vector v_1;
  
  _filter_elems.
  super__Vector_base<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  _filter_elems.
  super__Vector_base<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  _filter_elems.
  super__Vector_base<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = std::thread::hardware_concurrency();
  iVar6 = 0;
  if (0 < iVar5) {
    iVar6 = iVar5;
  }
  for (iVar11 = 0; iVar11 != iVar6; iVar11 = iVar11 + 1) {
    cVar7 = clock();
    uVar8 = (uint)((int)cVar7 * iVar5 + iVar11) % 0x7fffffff;
    v_2.z = 1.0;
    v_2._0_16_ = ZEXT416(uVar8 + (uVar8 == 0));
    uVar12 = (long)samps / (long)iVar5 & 0xffffffff;
    if ((int)((long)samps / (long)iVar5) < 1) {
      uVar12 = 0;
    }
    while (iVar10 = (int)uVar12, uVar12 = (ulong)(iVar10 - 1), iVar10 != 0) {
      dVar1 = Random::operator()((Random *)&v_2);
      dVar15 = Random::operator()((Random *)&v_2);
      dVar16 = (double)(((float)dVar1 + (float)x) / (float)width) + -0.5;
      dVar1 = (double)(((float)dVar15 + (float)y) / (float)height) + -0.5;
      dVar15 = cam.d.y + dVar1 * cy.y + dVar16 * cx.y;
      v.y._0_4_ = SUB84(dVar15,0);
      v.x = cam.d.x + dVar1 * cy.x + dVar16 * cx.x;
      v.y._4_4_ = (int)((ulong)dVar15 >> 0x20);
      v.z = cy.z * dVar1 + cx.z * dVar16 + cam.d.z;
      Vector::Normalize(&filter.first,&v);
      v_1.z = cam.o.z;
      v_1.y = cam.o.y;
      v_1.x = cam.o.x;
      indirect_filter(&filter,(Ray *)&v_1,(Random *)&v_2,0,1);
      std::vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>::push_back
                (&_filter_elems,&filter);
    }
  }
  local_144 = 0.0;
  for (iVar6 = 0; iVar6 < height; iVar6 = iVar6 + 1) {
    local_118 = 0.0;
    for (uVar8 = 0; iVar11 = height, iVar5 = width, (int)uVar8 < width; uVar8 = uVar8 + 1) {
      dVar1 = ((double)(int)uVar8 + 0.5) / (double)width + -0.5;
      dVar16 = ((double)iVar6 + 0.5) / (double)height + -0.5;
      dVar15 = cam.d.y + dVar16 * cy.y + dVar1 * cx.y;
      v_1.y._0_4_ = SUB84(dVar15,0);
      v_1.x = cam.d.x + dVar16 * cy.x + dVar1 * cx.x;
      v_1.y._4_4_ = (int)((ulong)dVar15 >> 0x20);
      v_1.z = cy.z * dVar16 + cx.z * dVar1 + cam.d.z;
      Vector::Normalize(&filter.first,&v_1);
      filter.first.z = cam.o.z;
      filter.first.x = cam.o.x;
      filter.first.y = cam.o.y;
      filter.second.z = v_1.z;
      filter.second.x = v_1.x;
      filter.second.y = v_1.y;
      bVar4 = Intersect(&spheres,(Ray *)&filter,&v.x,&id);
      ppVar3 = _filter_elems.
               super__Vector_base<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar4) {
        dVar1 = v.x * filter.second.x + filter.first.x;
        dVar15 = v.x * filter.second.y + filter.first.y;
        auVar2._8_4_ = SUB84(dVar15,0);
        auVar2._0_8_ = dVar1;
        auVar2._12_4_ = (int)((ulong)dVar15 >> 0x20);
        dVar15 = filter.second.z * v.x + filter.first.z;
        iVar5 = iVar11 * (iVar5 + ~uVar8) + iVar6;
        fVar14 = 0.0;
        for (ppVar9 = _filter_elems.
                      super__Vector_base<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar3;
            ppVar9 = ppVar9 + 1) {
          dStack_e0 = auVar2._8_8_;
          dStack_e0 = dStack_e0 - (ppVar9->first).y;
          v_2.y._0_4_ = SUB84(dStack_e0,0);
          v_2.x = dVar1 - (ppVar9->first).x;
          v_2.y._4_4_ = (int)((ulong)dStack_e0 >> 0x20);
          v_2.z = dVar15 - (ppVar9->first).z;
          dVar16 = Vector::Norm(&v_2);
          fVar13 = 0.3989423 / filterRadius;
          dVar16 = exp((dVar16 / (double)filterRadius) * (dVar16 / (double)filterRadius) * -0.5);
          fVar14 = (float)(dVar16 * (double)fVar13 * (ppVar9->second).x + (double)fVar14);
        }
        fVar14 = ((float)(nPassesFilter * samps) * ref_img[iVar5] + fVar14 * 20.0) /
                 (float)((nPassesFilter + 1) * samps);
        ref_img[iVar5] = fVar14;
        if (local_118 <= fVar14) {
          local_118 = fVar14;
        }
      }
    }
    if (local_118 <= local_144) {
      local_118 = local_144;
    }
    local_144 = local_118;
  }
  ref_scale = 1.0 / local_144;
  dVar1 = ((double)nPassesFilter + 0.8) / ((double)nPassesFilter + 1.0);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  filterRadius = (float)((double)filterRadius * dVar1);
  nPassesFilter = nPassesFilter + 1;
  std::_Vector_base<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>::
  ~_Vector_base(&_filter_elems.
                 super__Vector_base<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>
               );
  return;
}

Assistant:

void BruteForceTexture(int x, int y, int samps = 1000) {

   std::vector<PosFilter> _filter_elems;

   // Sub pixel sampling
   const int nthread = std::thread::hardware_concurrency();
   #pragma omp parallel for schedule(dynamic, 1)
   for(int t=0; t<nthread; ++t) {
      Random rng(t + nthread*clock());

      for(int s=0; s<samps/nthread; s++){

         // Create the RNG and get the sub-pixel sample
         float dx = rng();
         float dy = rng();

         // Generate the pixel direction
         Vector d = cx*((dx + x)/width  - .5) +
                    cy*((dy + y)/height - .5) + cam.d;
         d.Normalize();

         // Evaluate the Covariance and Radiance at the pixel location
         const auto filter = indirect_filter(Ray(cam.o, d), rng, 0, 1);
         #pragma omp critical
         {
            _filter_elems.push_back(filter);
         }
      }
   }

   // Loop over the rows and columns of the image and evaluate radiance and
   // covariance per pixel using Monte-Carlo.
   float max_ref = 0.0f;
   #pragma omp parallel for schedule(dynamic, 1), shared(max_ref)
   for (int y=0; y<height; y++){
      float max_temp = 0.0f;

      for (int x=0; x<width; x++) {
         int i=(width-x-1)*height+y;
         float _r = 0.0f;

         // Generate the pixel direction
         Vector d = cx*((0.5 + x)/width  - .5) +
                    cy*((0.5 + y)/height - .5) + cam.d;
         d.Normalize();

         Ray ray(cam.o, d);
         double t; int id;
         if(!Intersect(spheres, ray, t, id)){ continue; }
         Vector hitp = ray.o + t*ray.d;

         for(auto& elem : _filter_elems) {
            const auto& p = elem.first;
            const auto  x = Vector::Norm(hitp-p) / filterRadius;
            _r += (0.3989422804f/filterRadius) * exp(-0.5f * pow(x, 2)) * elem.second.x;
         }

         const auto scale = 20.f;
         const auto Nold  = nPassesFilter * samps;
         const auto Nnew  = (nPassesFilter+1) * samps;
         ref_img[i] = (ref_img[i]*Nold + scale*_r) / float(Nnew);
         max_temp   = std::max(ref_img[i], max_temp);
      }

      #pragma omp critical
      {
         max_ref = std::max(max_ref, max_temp);
      }
   }

   // Update the scaling
   ref_scale = 1.0f/max_ref;

   // Progressive refinement of the radius and number of passes
   filterRadius *= sqrt((nPassesFilter + 0.8) / (nPassesFilter + 1.0));
   ++nPassesFilter;
}